

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> __thiscall
llbuild::basic::DeviceAgnosticFileSystem::from
          (DeviceAgnosticFileSystem *this,
          unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          *fs)

{
  _func_int **in_RAX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  llvm::
  make_unique<llbuild::basic::DeviceAgnosticFileSystem,std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>>
            ((llvm *)&local_18,fs);
  (this->super_FileSystem)._vptr_FileSystem = local_18;
  return (__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FileSystem>
basic::DeviceAgnosticFileSystem::from(std::unique_ptr<FileSystem> fs) {
  return llvm::make_unique<DeviceAgnosticFileSystem>(std::move(fs));
}